

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O1

int Nwk_ManMinimumBaseNode(Nwk_Obj_t *pObj,Vec_Int_t *vTruth,int fVerbose)

{
  Nwk_Man_t *p;
  int iVar1;
  uint uSupp;
  uint *pTruth;
  Nwk_Obj_t *pObj_00;
  Hop_Obj_t *pHVar2;
  Nwk_Obj_t *pFanin;
  long lVar3;
  int iVar4;
  
  p = pObj->pMan;
  iVar4 = 0;
  pTruth = Hop_ManConvertAigToTruth
                     (p->pManHop,(Hop_Obj_t *)((ulong)pObj->pFunc & 0xfffffffffffffffe),
                      pObj->nFanins,vTruth,0);
  iVar1 = Kit_TruthSupportSize(pTruth,pObj->nFanins);
  if (iVar1 != pObj->nFanins) {
    uSupp = Kit_TruthSupport(pTruth,pObj->nFanins);
    pObj_00 = Nwk_ManCreateNode(p,iVar1,pObj->nFanouts);
    iVar1 = pObj->nFanins;
    if ((0 < iVar1) && (pFanin = *pObj->pFanio, pFanin != (Nwk_Obj_t *)0x0)) {
      lVar3 = 1;
      do {
        if ((uSupp >> ((int)lVar3 - 1U & 0x1f) & 1) != 0) {
          Nwk_ObjAddFanin(pObj_00,pFanin);
        }
        iVar1 = pObj->nFanins;
        if (iVar1 <= lVar3) break;
        pFanin = pObj->pFanio[lVar3];
        lVar3 = lVar3 + 1;
      } while (pFanin != (Nwk_Obj_t *)0x0);
    }
    pHVar2 = Hop_Remap(p->pManHop,pObj->pFunc,uSupp,iVar1);
    pObj_00->pFunc = pHVar2;
    if (fVerbose != 0) {
      printf("Reducing node %d fanins from %d to %d.\n",(ulong)(uint)pObj->Id,
             (ulong)(uint)pObj->nFanins,(ulong)(uint)pObj_00->nFanins);
    }
    Nwk_ObjReplace(pObj,pObj_00);
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

int Nwk_ManMinimumBaseNode( Nwk_Obj_t * pObj, Vec_Int_t * vTruth, int fVerbose )
{
    unsigned * pTruth;
    Nwk_Obj_t * pFanin, * pObjNew;
    Nwk_Man_t * pNtk = pObj->pMan;
    int uSupp, nSuppSize, k, Counter = 0;
    pTruth = Hop_ManConvertAigToTruth( pNtk->pManHop, Hop_Regular(pObj->pFunc), Nwk_ObjFaninNum(pObj), vTruth, 0 );
    nSuppSize = Kit_TruthSupportSize(pTruth, Nwk_ObjFaninNum(pObj));
    if ( nSuppSize == Nwk_ObjFaninNum(pObj) )
        return 0;
    Counter++;
    uSupp = Kit_TruthSupport( pTruth, Nwk_ObjFaninNum(pObj) );
    // create new node with the given support
    pObjNew = Nwk_ManCreateNode( pNtk, nSuppSize, Nwk_ObjFanoutNum(pObj) );
    Nwk_ObjForEachFanin( pObj, pFanin, k )
        if ( uSupp & (1 << k) )
            Nwk_ObjAddFanin( pObjNew, pFanin );
    pObjNew->pFunc = Hop_Remap( pNtk->pManHop, pObj->pFunc, uSupp, Nwk_ObjFaninNum(pObj) );
    if ( fVerbose )
        printf( "Reducing node %d fanins from %d to %d.\n", 
            pObj->Id, Nwk_ObjFaninNum(pObj), Nwk_ObjFaninNum(pObjNew) );
    Nwk_ObjReplace( pObj, pObjNew );
    return 1;
}